

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

void u_versionFromString_63(uint8_t *versionArray,char *versionString)

{
  ulong uVar1;
  ushort local_22;
  char *pcStack_20;
  uint16_t part;
  char *end;
  char *versionString_local;
  uint8_t *versionArray_local;
  
  local_22 = 0;
  if (versionArray != (uint8_t *)0x0) {
    end = versionString;
    versionString_local = (char *)versionArray;
    if (versionString != (char *)0x0) {
      while( true ) {
        uVar1 = strtoul(end,&stack0xffffffffffffffe0,10);
        versionString_local[local_22] = (char)uVar1;
        if (((pcStack_20 == end) || (local_22 = local_22 + 1, local_22 == 4)) ||
           (*pcStack_20 != '.')) break;
        end = pcStack_20 + 1;
      }
    }
    while (local_22 < 4) {
      versionString_local[local_22] = '\0';
      local_22 = local_22 + 1;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_versionFromString(UVersionInfo versionArray, const char *versionString) {
    char *end;
    uint16_t part=0;

    if(versionArray==NULL) {
        return;
    }

    if(versionString!=NULL) {
        for(;;) {
            versionArray[part]=(uint8_t)uprv_strtoul(versionString, &end, 10);
            if(end==versionString || ++part==U_MAX_VERSION_LENGTH || *end!=U_VERSION_DELIMITER) {
                break;
            }
            versionString=end+1;
        }
    }

    while(part<U_MAX_VERSION_LENGTH) {
        versionArray[part++]=0;
    }
}